

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog_util.c
# Opt level: O1

int read_full_contents(file_stream *strm)

{
  void *__ptr;
  void *pvVar1;
  ssize_t sVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  size_t __size;
  bool bVar6;
  
  __size = 0x1000;
  __ptr = xmalloc(0x1000);
  if (__ptr == (void *)0x0) {
    iVar4 = -1;
  }
  else {
    sVar5 = 0;
    do {
      if (sVar5 == __size) {
        if (__size == 0xffffffffffffffff) {
          __size = 0xffffffffffffffff;
          bVar6 = false;
        }
        else {
          bVar6 = CARRY8(__size,__size);
          __size = __size * 2;
          if (bVar6) {
            __size = 0xffffffffffffffff;
          }
          pvVar1 = realloc(__ptr,__size);
          bVar6 = pvVar1 != (void *)0x0;
          if (bVar6) {
            __ptr = pvVar1;
          }
        }
        if (!bVar6) {
          msg("Out of memory!  %s is too large to be processed by this program as currently implemented."
              ,strm->name);
          uVar3 = 0xffffffff;
          goto LAB_001065ff;
        }
      }
      sVar2 = xread(strm,(void *)((long)__ptr + sVar5),__size - sVar5);
      uVar3 = (uint)sVar2;
      if ((int)uVar3 < 0) {
LAB_001065ff:
        free(__ptr);
        return uVar3;
      }
      sVar5 = sVar5 + (uVar3 & 0x7fffffff);
    } while (uVar3 != 0);
    strm->mmap_mem = __ptr;
    strm->mmap_size = sVar5;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int
read_full_contents(struct file_stream *strm)
{
	size_t filled = 0;
	size_t capacity = 4096;
	char *buf;
	int ret;

	buf = xmalloc(capacity);
	if (buf == NULL)
		return -1;
	do {
		if (filled == capacity) {
			char *newbuf;

			if (capacity == SIZE_MAX)
				goto oom;
			capacity += MIN(SIZE_MAX - capacity, capacity);
			newbuf = realloc(buf, capacity);
			if (newbuf == NULL)
				goto oom;
			buf = newbuf;
		}
		ret = xread(strm, &buf[filled], capacity - filled);
		if (ret < 0)
			goto err;
		filled += ret;
	} while (ret != 0);

	strm->mmap_mem = buf;
	strm->mmap_size = filled;
	return 0;

err:
	free(buf);
	return ret;
oom:
	msg("Out of memory!  %"TS" is too large to be processed by "
	    "this program as currently implemented.", strm->name);
	ret = -1;
	goto err;
}